

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

void __thiscall
spirv_cross::Compiler::CombinedImageSamplerHandler::register_combined_image_sampler
          (CombinedImageSamplerHandler *this,SPIRFunction *caller,VariableID combined_module_id,
          VariableID image_id,VariableID sampler_id,bool depth)

{
  ID id;
  Parameter *pPVar1;
  Parameter *pPVar2;
  size_t sVar3;
  Compiler *pCVar4;
  bool bVar5;
  uint32_t id_00;
  long lVar6;
  SPIRType *pSVar7;
  SPIRType *this_00;
  SPIRType *this_01;
  long lVar8;
  Parameter *pPVar9;
  difference_type __trip_count;
  long lVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2;
  Parameter *pPVar11;
  Parameter *pPVar12;
  CombinedImageSamplerParameter *pCVar13;
  CombinedImageSamplerParameter *__it;
  uint32_t ptr_type_id;
  CombinedImageSamplerParameter param;
  undefined1 local_a8 [8];
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL> *local_88;
  SPIRFunction *local_80;
  CombinedImageSamplerParameter *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  param.id.id = 0;
  param.global_image = true;
  param.global_sampler = true;
  pPVar2 = (caller->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
  sVar3 = (caller->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
  lVar6 = sVar3 * 0x14;
  pPVar1 = pPVar2 + sVar3;
  lVar10 = (long)sVar3 >> 2;
  pPVar11 = pPVar2;
  for (lVar8 = lVar10; pPVar9 = pPVar11, 0 < lVar8; lVar8 = lVar8 + -1) {
    if ((pPVar11->id).id == image_id.id) goto LAB_0037539b;
    if (pPVar11[1].id.id == image_id.id) {
      pPVar9 = pPVar11 + 1;
      goto LAB_0037539b;
    }
    if (pPVar11[2].id.id == image_id.id) {
      pPVar9 = pPVar11 + 2;
      goto LAB_0037539b;
    }
    if (pPVar11[3].id.id == image_id.id) {
      pPVar9 = pPVar11 + 3;
      goto LAB_0037539b;
    }
    pPVar11 = pPVar11 + 4;
    lVar6 = lVar6 + -0x50;
  }
  lVar6 = lVar6 / 0x14;
  if (lVar6 == 1) {
LAB_0037537a:
    pPVar9 = pPVar11;
    if ((pPVar11->id).id != image_id.id) {
      pPVar9 = pPVar1;
    }
  }
  else if (lVar6 == 2) {
LAB_00375370:
    if ((pPVar9->id).id != image_id.id) {
      pPVar11 = pPVar9 + 1;
      goto LAB_0037537a;
    }
  }
  else {
    pPVar9 = pPVar1;
    if ((lVar6 == 3) && (pPVar9 = pPVar11, (pPVar11->id).id != image_id.id)) {
      pPVar9 = pPVar11 + 1;
      goto LAB_00375370;
    }
  }
LAB_0037539b:
  lVar8 = sVar3 * 0x14;
  pPVar11 = pPVar2;
  for (; 0 < lVar10; lVar10 = lVar10 + -1) {
    pPVar12 = pPVar11;
    if ((pPVar11->id).id == sampler_id.id) goto LAB_0037541b;
    if (pPVar11[1].id.id == sampler_id.id) {
      pPVar12 = pPVar11 + 1;
      goto LAB_0037541b;
    }
    if (pPVar11[2].id.id == sampler_id.id) {
      pPVar12 = pPVar11 + 2;
      goto LAB_0037541b;
    }
    if (pPVar11[3].id.id == sampler_id.id) {
      pPVar12 = pPVar11 + 3;
      goto LAB_0037541b;
    }
    pPVar11 = pPVar11 + 4;
    lVar8 = lVar8 + -0x50;
  }
  lVar8 = lVar8 / 0x14;
  if (lVar8 == 1) {
LAB_003753fa:
    pPVar12 = pPVar11;
    if ((pPVar11->id).id != sampler_id.id) {
      pPVar12 = pPVar1;
    }
  }
  else if (lVar8 == 2) {
LAB_003753f0:
    pPVar12 = pPVar11;
    if ((pPVar11->id).id != sampler_id.id) {
      pPVar11 = pPVar11 + 1;
      goto LAB_003753fa;
    }
  }
  else {
    pPVar12 = pPVar1;
    if ((lVar8 == 3) && (pPVar12 = pPVar11, (pPVar11->id).id != sampler_id.id)) {
      pPVar11 = pPVar11 + 1;
      goto LAB_003753f0;
    }
  }
LAB_0037541b:
  if (pPVar9 == pPVar1) {
    param.image_id.id = image_id.id;
    if (pPVar12 == pPVar1) {
      return;
    }
LAB_00375449:
    param._12_2_ = param._12_2_ & 0xff;
    param.sampler_id.id = (uint32_t)(((long)pPVar12 - (long)pPVar2) / 0x14);
  }
  else {
    param.global_image = false;
    param.global_sampler = true;
    param.image_id.id = (uint32_t)(((long)pPVar9 - (long)pPVar2) / 0x14);
    param.sampler_id.id = sampler_id.id;
    if (pPVar12 != pPVar1) goto LAB_00375449;
  }
  local_88 = &caller->combined_parameters;
  __it = (caller->combined_parameters).
         super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.ptr;
  sVar3 = (caller->combined_parameters).
          super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.buffer_size;
  lVar6 = sVar3 * 0x10;
  local_78 = __it + sVar3;
  local_a8 = (undefined1  [8])&param;
  param.depth = depth;
  local_80 = caller;
  for (lVar8 = (long)sVar3 >> 2; pCVar13 = __it, 0 < lVar8; lVar8 = lVar8 + -1) {
    bVar5 = __gnu_cxx::__ops::
            _Iter_pred<spirv_cross::Compiler::CombinedImageSamplerHandler::register_combined_image_sampler(spirv_cross::SPIRFunction&,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,bool)::$_2>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_EpicGames[P]SPIRV_Cross_spirv_cross_cpp:2708:21)>
                          *)local_a8,__it);
    if (bVar5) goto LAB_0037555b;
    bVar5 = __gnu_cxx::__ops::
            _Iter_pred<spirv_cross::Compiler::CombinedImageSamplerHandler::register_combined_image_sampler(spirv_cross::SPIRFunction&,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,bool)::$_2>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_EpicGames[P]SPIRV_Cross_spirv_cross_cpp:2708:21)>
                          *)local_a8,__it + 1);
    pCVar13 = __it + 1;
    if (bVar5) goto LAB_0037555b;
    bVar5 = __gnu_cxx::__ops::
            _Iter_pred<spirv_cross::Compiler::CombinedImageSamplerHandler::register_combined_image_sampler(spirv_cross::SPIRFunction&,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,bool)::$_2>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_EpicGames[P]SPIRV_Cross_spirv_cross_cpp:2708:21)>
                          *)local_a8,__it + 2);
    pCVar13 = __it + 2;
    if (bVar5) goto LAB_0037555b;
    bVar5 = __gnu_cxx::__ops::
            _Iter_pred<spirv_cross::Compiler::CombinedImageSamplerHandler::register_combined_image_sampler(spirv_cross::SPIRFunction&,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,bool)::$_2>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_EpicGames[P]SPIRV_Cross_spirv_cross_cpp:2708:21)>
                          *)local_a8,__it + 3);
    pCVar13 = __it + 3;
    if (bVar5) goto LAB_0037555b;
    __it = __it + 4;
    lVar6 = lVar6 + -0x40;
  }
  lVar6 = lVar6 >> 4;
  if (lVar6 == 1) {
LAB_00375788:
    bVar5 = __gnu_cxx::__ops::
            _Iter_pred<spirv_cross::Compiler::CombinedImageSamplerHandler::register_combined_image_sampler(spirv_cross::SPIRFunction&,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,bool)::$_2>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_EpicGames[P]SPIRV_Cross_spirv_cross_cpp:2708:21)>
                          *)local_a8,__it);
    pCVar13 = __it;
    if (!bVar5) goto LAB_00375566;
  }
  else if (lVar6 == 2) {
LAB_00375539:
    bVar5 = __gnu_cxx::__ops::
            _Iter_pred<spirv_cross::Compiler::CombinedImageSamplerHandler::register_combined_image_sampler(spirv_cross::SPIRFunction&,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,bool)::$_2>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_EpicGames[P]SPIRV_Cross_spirv_cross_cpp:2708:21)>
                          *)local_a8,pCVar13);
    if (!bVar5) {
      __it = pCVar13 + 1;
      goto LAB_00375788;
    }
  }
  else {
    if (lVar6 != 3) goto LAB_00375566;
    bVar5 = __gnu_cxx::__ops::
            _Iter_pred<spirv_cross::Compiler::CombinedImageSamplerHandler::register_combined_image_sampler(spirv_cross::SPIRFunction&,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,spirv_cross::TypedID<(spirv_cross::Types)2>,bool)::$_2>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_EpicGames[P]SPIRV_Cross_spirv_cross_cpp:2708:21)>
                          *)local_a8,__it);
    if (!bVar5) {
      pCVar13 = __it + 1;
      goto LAB_00375539;
    }
  }
LAB_0037555b:
  if (pCVar13 != local_78) {
    return;
  }
LAB_00375566:
  id_00 = ParsedIR::increase_bound_by(&this->compiler->ir,3);
  id.id = id_00 + 2;
  ptr_type_id = id_00 + 1;
  pSVar7 = expression_type(this->compiler,image_id.id);
  this_00 = set<spirv_cross::SPIRType>(this->compiler,id_00);
  this_01 = set<spirv_cross::SPIRType>(this->compiler,id_00 + 1);
  SPIRType::operator=(this_00,pSVar7);
  (this_00->super_IVariant).self.id = id_00;
  *(undefined4 *)&(this_00->super_IVariant).field_0xc = 0x11;
  this_00->pointer = false;
  this_00->storage = StorageClassGeneric;
  (this_00->image).depth = depth;
  SPIRType::operator=(this_01,this_00);
  this_01->pointer = true;
  this_01->storage = StorageClassUniformConstant;
  (this_01->parent_type).id = id_00;
  local_a8._0_4_ = 7;
  ts_2 = &local_70;
  local_70._M_dataplus._M_p._0_4_ = 0;
  set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int>
            (this->compiler,id.id,&ptr_type_id,(StorageClass *)local_a8,(int *)ts_2);
  bVar5 = ParsedIR::has_decoration(&this->compiler->ir,(ID)sampler_id.id,DecorationRelaxedPrecision)
  ;
  if (((bVar5) ||
      (bVar5 = ParsedIR::has_decoration
                         (&this->compiler->ir,(ID)image_id.id,DecorationRelaxedPrecision), bVar5))
     || ((combined_module_id.id != 0 &&
         (bVar5 = ParsedIR::has_decoration
                            (&this->compiler->ir,(ID)combined_module_id.id,
                             DecorationRelaxedPrecision), bVar5)))) {
    ParsedIR::set_decoration(&this->compiler->ir,id,DecorationRelaxedPrecision,0);
  }
  pCVar4 = this->compiler;
  param.id.id = id.id;
  (*pCVar4->_vptr_Compiler[6])(&local_70,pCVar4,(ulong)image_id.id,1);
  (*this->compiler->_vptr_Compiler[6])(&local_50,this->compiler,(ulong)sampler_id.id,1);
  join<char_const(&)[21],std::__cxx11::string,std::__cxx11::string>
            ((string *)local_a8,(spirv_cross *)"SPIRV_Cross_Combined",(char (*) [21])&local_70,
             &local_50,ts_2);
  ParsedIR::set_name(&pCVar4->ir,id,(string *)local_a8);
  ::std::__cxx11::string::~string((string *)local_a8);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::~string((string *)&local_70);
  SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL>::push_back
            (local_88,&param);
  local_a8._4_4_ = id.id;
  local_a8._0_4_ = ptr_type_id;
  local_a0 = 0;
  local_98._M_local_buf[0] = '\x01';
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::push_back
            (&local_80->shadow_arguments,(Parameter *)local_a8);
  return;
}

Assistant:

void Compiler::CombinedImageSamplerHandler::register_combined_image_sampler(SPIRFunction &caller,
                                                                            VariableID combined_module_id,
                                                                            VariableID image_id, VariableID sampler_id,
                                                                            bool depth)
{
	// We now have a texture ID and a sampler ID which will either be found as a global
	// or a parameter in our own function. If both are global, they will not need a parameter,
	// otherwise, add it to our list.
	SPIRFunction::CombinedImageSamplerParameter param = {
		0u, image_id, sampler_id, true, true, depth,
	};

	auto texture_itr = find_if(begin(caller.arguments), end(caller.arguments),
	                           [image_id](const SPIRFunction::Parameter &p) { return p.id == image_id; });
	auto sampler_itr = find_if(begin(caller.arguments), end(caller.arguments),
	                           [sampler_id](const SPIRFunction::Parameter &p) { return p.id == sampler_id; });

	if (texture_itr != end(caller.arguments))
	{
		param.global_image = false;
		param.image_id = uint32_t(texture_itr - begin(caller.arguments));
	}

	if (sampler_itr != end(caller.arguments))
	{
		param.global_sampler = false;
		param.sampler_id = uint32_t(sampler_itr - begin(caller.arguments));
	}

	if (param.global_image && param.global_sampler)
		return;

	auto itr = find_if(begin(caller.combined_parameters), end(caller.combined_parameters),
	                   [&param](const SPIRFunction::CombinedImageSamplerParameter &p) {
		                   return param.image_id == p.image_id && param.sampler_id == p.sampler_id &&
		                          param.global_image == p.global_image && param.global_sampler == p.global_sampler;
	                   });

	if (itr == end(caller.combined_parameters))
	{
		uint32_t id = compiler.ir.increase_bound_by(3);
		auto type_id = id + 0;
		auto ptr_type_id = id + 1;
		auto combined_id = id + 2;
		auto &base = compiler.expression_type(image_id);
		auto &type = compiler.set<SPIRType>(type_id);
		auto &ptr_type = compiler.set<SPIRType>(ptr_type_id);

		type = base;
		type.self = type_id;
		type.basetype = SPIRType::SampledImage;
		type.pointer = false;
		type.storage = StorageClassGeneric;
		type.image.depth = depth;

		ptr_type = type;
		ptr_type.pointer = true;
		ptr_type.storage = StorageClassUniformConstant;
		ptr_type.parent_type = type_id;

		// Build new variable.
		compiler.set<SPIRVariable>(combined_id, ptr_type_id, StorageClassFunction, 0);

		// Inherit RelaxedPrecision.
		// If any of OpSampledImage, underlying image or sampler are marked, inherit the decoration.
		bool relaxed_precision =
		    compiler.has_decoration(sampler_id, DecorationRelaxedPrecision) ||
		    compiler.has_decoration(image_id, DecorationRelaxedPrecision) ||
		    (combined_module_id && compiler.has_decoration(combined_module_id, DecorationRelaxedPrecision));

		if (relaxed_precision)
			compiler.set_decoration(combined_id, DecorationRelaxedPrecision);

		param.id = combined_id;

		compiler.set_name(combined_id,
		                  join("SPIRV_Cross_Combined", compiler.to_name(image_id), compiler.to_name(sampler_id)));

		caller.combined_parameters.push_back(param);
		caller.shadow_arguments.push_back({ ptr_type_id, combined_id, 0u, 0u, true });
	}
}